

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::addArrayElement(JSON *this,JSON *val)

{
  bool bVar1;
  element_type *this_00;
  pointer pJVar2;
  vector<JSON,_std::allocator<JSON>_> *this_01;
  reference pvVar3;
  runtime_error *this_02;
  JSON_array *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar4;
  long local_78;
  long local_70;
  value_type local_38;
  long local_28;
  JSON_array *arr;
  JSON *val_local;
  JSON *this_local;
  
  arr = in_RDX;
  val_local = val;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)val);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)val);
    pJVar2 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                       (&this_00->value);
    if (pJVar2 == (pointer)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = __dynamic_cast(pJVar2,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    }
    local_78 = local_70;
  }
  else {
    local_78 = 0;
  }
  local_28 = local_78;
  if (local_78 != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)arr);
    if (bVar1) {
      std::vector<JSON,_std::allocator<JSON>_>::push_back
                ((vector<JSON,_std::allocator<JSON>_> *)(local_28 + 0x10),(value_type *)arr);
    }
    else {
      this_01 = (vector<JSON,_std::allocator<JSON>_> *)(local_28 + 0x10);
      makeNull();
      std::vector<JSON,_std::allocator<JSON>_>::push_back(this_01,&local_38);
      ~JSON(&local_38);
    }
    pvVar3 = std::vector<JSON,_std::allocator<JSON>_>::back
                       ((vector<JSON,_std::allocator<JSON>_> *)(local_28 + 0x10));
    JSON(this,pvVar3);
    JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (JSON)JVar4.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"JSON::addArrayElement called on non-array");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JSON
JSON::addArrayElement(JSON const& val)
{
    if (auto* arr = m ? dynamic_cast<JSON_array*>(m->value.get()) : nullptr) {
        if (val.m) {
            arr->elements.push_back(val);
        } else {
            arr->elements.push_back(makeNull());
        }
        return arr->elements.back();
    }
    throw std::runtime_error("JSON::addArrayElement called on non-array");
    return {}; // unreachable
}